

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O0

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,PlugInInfo *plugIn)

{
  CppUnitTestPlugIn *pCVar1;
  DynamicLibraryManager *this_00;
  TestFactoryRegistry *pTVar2;
  allocator<char> local_39;
  string local_38;
  PlugInInfo *local_18;
  PlugInInfo *plugIn_local;
  PlugInManager *this_local;
  
  pCVar1 = plugIn->m_interface;
  local_18 = plugIn;
  plugIn_local = (PlugInInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"All Tests",&local_39);
  pTVar2 = TestFactoryRegistry::getRegistry(&local_38);
  (*pCVar1->_vptr_CppUnitTestPlugIn[5])(pCVar1,pTVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18->m_manager;
  if (this_00 != (DynamicLibraryManager *)0x0) {
    DynamicLibraryManager::~DynamicLibraryManager(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

void 
PlugInManager::unload( PlugInInfo &plugIn )
{
  try
  {
    plugIn.m_interface->uninitialize( &TestFactoryRegistry::getRegistry() );
    delete plugIn.m_manager;
  }
  catch (...)
  {
    delete plugIn.m_manager;
    plugIn.m_manager = NULL;
    throw;
  }
}